

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O2

EGLConfig deqp::egl::anon_unknown_0::getEGLConfig
                    (Library *egl,EGLDisplay eglDisplay,bool preserveBuffer)

{
  FilterList *this;
  EGLConfig pvVar1;
  FilterList filters;
  _Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = eglu::FilterList::operator<<((FilterList *)&local_38,isWindow);
  eglu::FilterList::operator<<(this,isES2Renderable);
  if (preserveBuffer) {
    eglu::FilterList::operator<<((FilterList *)&local_38,hasPreserveSwap);
  }
  pvVar1 = eglu::chooseSingleConfig(egl,eglDisplay,(FilterList *)&local_38);
  std::
  _Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ::~_Vector_base(&local_38);
  return pvVar1;
}

Assistant:

EGLConfig getEGLConfig (const Library& egl, EGLDisplay eglDisplay, bool preserveBuffer)
{
	eglu::FilterList filters;

	filters << isWindow << isES2Renderable;
	if (preserveBuffer)
		filters << hasPreserveSwap;

	return eglu::chooseSingleConfig(egl, eglDisplay, filters);
}